

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_test.cc
# Opt level: O0

void TestCertReparse(Span<const_unsigned_char> der)

{
  Span<const_unsigned_char> span;
  Span<const_unsigned_char> span_00;
  bool bVar1;
  stack_st_X509 *psVar2;
  char *pcVar3;
  pointer psVar4;
  cbb_st *pcVar5;
  size_t sVar6;
  X509 *pXVar7;
  X509 *pXVar8;
  PKCS7 *pPVar9;
  uchar *puVar10;
  pointer pPVar11;
  size_t sVar12;
  char *in_R9;
  AssertHelper local_7e8;
  Message local_7e0;
  Bytes local_7d8;
  Bytes local_7c8;
  undefined1 local_7b8 [8];
  AssertionResult gtest_ar_13;
  UniquePtr<uint8_t> free_result4_data;
  Message local_798;
  int local_78c;
  undefined1 local_788 [8];
  AssertionResult gtest_ar_12;
  pointer puStack_770;
  int result4_len;
  uint8_t *result4_data;
  Message local_760;
  int local_758 [2];
  undefined1 local_750 [8];
  AssertionResult gtest_ar_11;
  X509 *b_2;
  X509 *a_2;
  size_t i_2;
  Message local_720;
  size_t local_718;
  size_t local_710;
  undefined1 local_708 [8];
  AssertionResult gtest_ar_10;
  stack_st_X509 *certs4;
  AssertHelper local_6d0;
  Message local_6c8;
  int local_6bc;
  undefined1 local_6b8 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_688;
  Message local_680;
  undefined1 local_678 [8];
  AssertionResult gtest_ar__12;
  Message local_660;
  Bytes local_658;
  tuple<stack_st_X509_*,_bssl::internal::Deleter> local_648;
  size_t sStack_640;
  Bytes local_630;
  undefined1 local_620 [8];
  AssertionResult gtest_ar_9;
  UniquePtr<uint8_t> free_result3_data;
  Message local_600;
  int local_5f4;
  undefined1 local_5f0 [8];
  AssertionResult gtest_ar_8;
  pointer puStack_5d8;
  int result3_len;
  uint8_t *result3_data;
  Message local_5c8;
  int local_5c0 [2];
  undefined1 local_5b8 [8];
  AssertionResult gtest_ar_7;
  X509 *b_1;
  X509 *a_1;
  size_t i_1;
  Message local_588;
  size_t local_580;
  size_t local_578;
  undefined1 local_570 [8];
  AssertionResult gtest_ar_6;
  stack_st_X509 *certs3;
  AssertHelper local_538;
  Message local_530;
  int local_524;
  undefined1 local_520 [8];
  AssertionResult gtest_ar__11;
  Message local_508;
  uchar *local_500;
  undefined1 local_4f8 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_4c8;
  Message local_4c0;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar__10;
  UniquePtr<PKCS7> pkcs7_obj;
  uint8_t *ptr;
  Message local_490;
  Bytes local_488;
  Bytes local_478;
  undefined1 local_468 [8];
  AssertionResult gtest_ar_4;
  UniquePtr<uint8_t> free_result2_data;
  AssertHelper local_430;
  Message local_428;
  int local_41c;
  undefined1 local_418 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_3e8;
  Message local_3e0;
  int local_3d4;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_3a0;
  Message local_398;
  int local_38c;
  undefined1 local_388 [8];
  AssertionResult gtest_ar__7;
  Message local_370;
  int local_368 [2];
  undefined1 local_360 [8];
  AssertionResult gtest_ar_3;
  X509 *b;
  X509 *a;
  size_t i;
  Message local_330;
  size_t local_328;
  size_t local_320;
  undefined1 local_318 [8];
  AssertionResult gtest_ar_2;
  Message local_300;
  size_t local_2f8;
  uint local_2ec;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_2b8;
  Message local_2b0;
  int local_2a4;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar__6;
  UniquePtr<uint8_t> free_result_data;
  AssertHelper local_268;
  Message local_260;
  int local_254;
  undefined1 local_250 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_220;
  Message local_218;
  int local_20c;
  undefined1 local_208 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_1d8;
  Message local_1d0;
  int local_1c4;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar__3;
  ScopedCBB cbb;
  Message local_178;
  size_t local_170;
  uint local_164;
  undefined1 local_160 [8];
  AssertionResult gtest_ar;
  AssertHelper local_130;
  Message local_128;
  int local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar__2;
  undefined1 local_f0 [8];
  CBS pkcs7;
  size_t result2_len;
  size_t result_len;
  uint8_t *result2_data;
  uint8_t *result_data;
  AssertHelper local_a0;
  Message local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<struct_stack_st_X509> certs2;
  string local_70;
  AssertHelper local_50;
  Message local_48 [3];
  undefined1 local_30 [8];
  AssertionResult gtest_ar_;
  UniquePtr<struct_stack_st_X509> certs;
  Span<const_unsigned_char> der_local;
  
  sVar12 = der.size_;
  certs._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl =
       (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)der.data_;
  psVar2 = sk_X509_new_null();
  std::unique_ptr<stack_st_X509,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<stack_st_X509,bssl::internal::Deleter> *)&gtest_ar_.message_,psVar2);
  testing::AssertionResult::AssertionResult<std::unique_ptr<stack_st_X509,bssl::internal::Deleter>>
            ((AssertionResult *)local_30,
             (unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(internal *)local_30,(AssertionResult *)0x8ba81c,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
               ,0x59,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    testing::Message::~Message(local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  if (bVar1) {
    psVar2 = sk_X509_new_null();
    std::unique_ptr<stack_st_X509,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<stack_st_X509,bssl::internal::Deleter> *)&gtest_ar__1.message_,psVar2);
    testing::AssertionResult::
    AssertionResult<std::unique_ptr<stack_st_X509,bssl::internal::Deleter>>
              ((AssertionResult *)local_90,
               (unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)&gtest_ar__1.message_,
               (type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
    if (!bVar1) {
      testing::Message::Message(&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&result_data,(internal *)local_90,(AssertionResult *)"certs2","false",
                 "true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                 ,0x5b,pcVar3);
      testing::internal::AssertHelper::operator=(&local_a0,&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      std::__cxx11::string::~string((string *)&result_data);
      testing::Message::~Message(&local_98);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
    if (bVar1) {
      gtest_ar__2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )certs._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl;
      span_00.size_ = sVar12;
      span_00.data_ =
           (uchar *)certs._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl;
      cbs_st::cbs_st((cbs_st *)local_f0,span_00);
      psVar4 = std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::get
                         ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)&gtest_ar_.message_)
      ;
      local_11c = PKCS7_get_certificates(psVar4,(CBS *)local_f0);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_118,&local_11c,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
      if (!bVar1) {
        testing::Message::Message(&local_128);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar.message_,(internal *)local_118,
                   (AssertionResult *)"PKCS7_get_certificates(certs.get(), &pkcs7)","false","true",
                   in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_130,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                   ,0x60,pcVar3);
        testing::internal::AssertHelper::operator=(&local_130,&local_128);
        testing::internal::AssertHelper::~AssertHelper(&local_130);
        std::__cxx11::string::~string((string *)&gtest_ar.message_);
        testing::Message::~Message(&local_128);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
      if (bVar1) {
        local_164 = 0;
        local_170 = CBS_len((CBS *)local_f0);
        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                  ((EqHelper *)local_160,"0u","CBS_len(&pkcs7)",&local_164,&local_170);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
        if (!bVar1) {
          testing::Message::Message(&local_178);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)((long)&cbb.ctx_.u + 0x18),kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                     ,0x61,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)((long)&cbb.ctx_.u + 0x18),&local_178);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&cbb.ctx_.u + 0x18))
          ;
          testing::Message::~Message(&local_178);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
        bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
                  ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&gtest_ar__3.message_);
        pcVar5 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                           ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                            &gtest_ar__3.message_);
        sVar6 = bssl::Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&certs);
        local_1c4 = CBB_init(pcVar5,sVar6);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_1c0,&local_1c4,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
        if (!bVar1) {
          testing::Message::Message(&local_1d0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_1c0,
                     (AssertionResult *)"CBB_init(cbb.get(), der.size())","false","true",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_1d8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                     ,100,pcVar3);
          testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
          testing::internal::AssertHelper::~AssertHelper(&local_1d8);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_1d0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
        if (bVar1) {
          pcVar5 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                             ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                              &gtest_ar__3.message_);
          psVar4 = std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::get
                             ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)
                              &gtest_ar_.message_);
          local_20c = PKCS7_bundle_certificates(pcVar5,psVar4);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_208,&local_20c,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
          if (!bVar1) {
            testing::Message::Message(&local_218);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__5.message_,(internal *)local_208,
                       (AssertionResult *)"PKCS7_bundle_certificates(cbb.get(), certs.get())",
                       "false","true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_220,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                       ,0x65,pcVar3);
            testing::internal::AssertHelper::operator=(&local_220,&local_218);
            testing::internal::AssertHelper::~AssertHelper(&local_220);
            std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
            testing::Message::~Message(&local_218);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
          if (bVar1) {
            pcVar5 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                               ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                &gtest_ar__3.message_);
            local_254 = CBB_finish(pcVar5,&result2_data,&result2_len);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_250,&local_254,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
            if (!bVar1) {
              testing::Message::Message(&local_260);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&free_result_data,(internal *)local_250,
                         (AssertionResult *)"CBB_finish(cbb.get(), &result_data, &result_len)",
                         "false","true",in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_268,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                         ,0x66,pcVar3);
              testing::internal::AssertHelper::operator=(&local_268,&local_260);
              testing::internal::AssertHelper::~AssertHelper(&local_268);
              std::__cxx11::string::~string((string *)&free_result_data);
              testing::Message::~Message(&local_260);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
            if (bVar1) {
              std::unique_ptr<unsigned_char,bssl::internal::Deleter>::
              unique_ptr<bssl::internal::Deleter,void>
                        ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)&gtest_ar__6.message_,
                         result2_data);
              CBS_init((CBS *)local_f0,result2_data,result2_len);
              psVar4 = std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::get
                                 ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)
                                  &gtest_ar__1.message_);
              local_2a4 = PKCS7_get_certificates(psVar4,(CBS *)local_f0);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_2a0,&local_2a4,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
              if (!bVar1) {
                testing::Message::Message(&local_2b0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_1.message_,(internal *)local_2a0,
                           (AssertionResult *)"PKCS7_get_certificates(certs2.get(), &pkcs7)","false"
                           ,"true",in_R9);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_2b8,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                           ,0x6a,pcVar3);
                testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
                testing::internal::AssertHelper::~AssertHelper(&local_2b8);
                std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
                testing::Message::~Message(&local_2b0);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
              if (bVar1) {
                local_2ec = 0;
                local_2f8 = CBS_len((CBS *)local_f0);
                testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                          ((EqHelper *)local_2e8,"0u","CBS_len(&pkcs7)",&local_2ec,&local_2f8);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_2e8);
                if (!bVar1) {
                  testing::Message::Message(&local_300);
                  pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                             ,0x6b,pcVar3);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_2.message_,&local_300);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_2.message_);
                  testing::Message::~Message(&local_300);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
                psVar4 = std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::get
                                   ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)
                                    &gtest_ar_.message_);
                local_320 = sk_X509_num(psVar4);
                psVar4 = std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::get
                                   ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)
                                    &gtest_ar__1.message_);
                local_328 = sk_X509_num(psVar4);
                testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                          ((EqHelper *)local_318,"sk_X509_num(certs.get())",
                           "sk_X509_num(certs2.get())",&local_320,&local_328);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_318);
                if (!bVar1) {
                  testing::Message::Message(&local_330);
                  pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_318);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&i,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                             ,0x70,pcVar3);
                  testing::internal::AssertHelper::operator=((AssertHelper *)&i,&local_330);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i);
                  testing::Message::~Message(&local_330);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
                if (bVar1) {
                  a = (X509 *)0x0;
                  while( true ) {
                    psVar4 = std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::get
                                       ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)
                                        &gtest_ar_.message_);
                    pXVar7 = (X509 *)sk_X509_num(psVar4);
                    if (pXVar7 <= a) break;
                    psVar4 = std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::get
                                       ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)
                                        &gtest_ar_.message_);
                    pXVar8 = (X509 *)sk_X509_value(psVar4,(size_t)a);
                    psVar4 = std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::get
                                       ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)
                                        &gtest_ar__1.message_);
                    gtest_ar_3.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl =
                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                          )sk_X509_value(psVar4,(size_t)a);
                    local_368[1] = 0;
                    local_368[0] = X509_cmp(pXVar8,(X509 *)gtest_ar_3.message_._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                              ((EqHelper *)local_360,"0","X509_cmp(a, b)",local_368 + 1,local_368);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_360);
                    if (!bVar1) {
                      testing::Message::Message(&local_370);
                      pcVar3 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_360);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar__7.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                                 ,0x74,pcVar3);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar__7.message_,&local_370);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar__7.message_);
                      testing::Message::~Message(&local_370);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
                    if (!bVar1) goto LAB_004da8fa;
                    a = (X509 *)((long)&a->cert_info + 1);
                  }
                  pcVar5 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::
                           get((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                               &gtest_ar__3.message_);
                  sVar6 = bssl::Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&certs)
                  ;
                  local_38c = CBB_init(pcVar5,sVar6);
                  testing::AssertionResult::AssertionResult<int>
                            ((AssertionResult *)local_388,&local_38c,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_388);
                  if (!bVar1) {
                    testing::Message::Message(&local_398);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__8.message_,(internal *)local_388,
                               (AssertionResult *)"CBB_init(cbb.get(), der.size())","false","true",
                               in_R9);
                    pcVar3 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_3a0,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                               ,0x77,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_3a0,&local_398);
                    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
                    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
                    testing::Message::~Message(&local_398);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
                  if (bVar1) {
                    pcVar5 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::
                             get((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                 &gtest_ar__3.message_);
                    psVar4 = std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::get
                                       ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)
                                        &gtest_ar__1.message_);
                    local_3d4 = PKCS7_bundle_certificates(pcVar5,psVar4);
                    testing::AssertionResult::AssertionResult<int>
                              ((AssertionResult *)local_3d0,&local_3d4,(type *)0x0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_3d0);
                    if (!bVar1) {
                      testing::Message::Message(&local_3e0);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar__9.message_,(internal *)local_3d0,
                                 (AssertionResult *)
                                 "PKCS7_bundle_certificates(cbb.get(), certs2.get())","false","true"
                                 ,in_R9);
                      pcVar3 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_3e8,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                                 ,0x78,pcVar3);
                      testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
                      testing::internal::AssertHelper::~AssertHelper(&local_3e8);
                      std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
                      testing::Message::~Message(&local_3e0);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
                    if (bVar1) {
                      pcVar5 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>
                               ::get((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                     &gtest_ar__3.message_);
                      local_41c = CBB_finish(pcVar5,(uint8_t **)&result_len,&pkcs7.len);
                      testing::AssertionResult::AssertionResult<int>
                                ((AssertionResult *)local_418,&local_41c,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_418);
                      if (!bVar1) {
                        testing::Message::Message(&local_428);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&free_result2_data,(internal *)local_418,
                                   (AssertionResult *)
                                   "CBB_finish(cbb.get(), &result2_data, &result2_len)","false",
                                   "true",in_R9);
                        pcVar3 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_430,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                                   ,0x79,pcVar3);
                        testing::internal::AssertHelper::operator=(&local_430,&local_428);
                        testing::internal::AssertHelper::~AssertHelper(&local_430);
                        std::__cxx11::string::~string((string *)&free_result2_data);
                        testing::Message::~Message(&local_428);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
                      if (bVar1) {
                        std::unique_ptr<unsigned_char,bssl::internal::Deleter>::
                        unique_ptr<bssl::internal::Deleter,void>
                                  ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)
                                   &gtest_ar_4.message_,(pointer)result_len);
                        Bytes::Bytes(&local_478,result2_data,result2_len);
                        Bytes::Bytes(&local_488,(uint8_t *)result_len,pkcs7.len);
                        testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                                  ((EqHelper *)local_468,"Bytes(result_data, result_len)",
                                   "Bytes(result2_data, result2_len)",&local_478,&local_488);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_468);
                        if (!bVar1) {
                          testing::Message::Message(&local_490);
                          pcVar3 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_468);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&ptr,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                                     ,0x7c,pcVar3);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&ptr,&local_490);
                          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ptr);
                          testing::Message::~Message(&local_490);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
                        pkcs7_obj._M_t.super___uniq_ptr_impl<PKCS7,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_PKCS7_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_PKCS7_*,_false>._M_head_impl =
                             (__uniq_ptr_data<PKCS7,_bssl::internal::Deleter,_true,_true>)
                             bssl::Span<const_unsigned_char>::data
                                       ((Span<const_unsigned_char> *)&certs);
                        sVar6 = bssl::Span<const_unsigned_char>::size
                                          ((Span<const_unsigned_char> *)&certs);
                        pPVar9 = d2i_PKCS7((PKCS7 **)0x0,(uchar **)&pkcs7_obj,sVar6);
                        std::unique_ptr<PKCS7,bssl::internal::Deleter>::
                        unique_ptr<bssl::internal::Deleter,void>
                                  ((unique_ptr<PKCS7,bssl::internal::Deleter> *)
                                   &gtest_ar__10.message_,(pointer)pPVar9);
                        testing::AssertionResult::
                        AssertionResult<std::unique_ptr<PKCS7,bssl::internal::Deleter>>
                                  ((AssertionResult *)local_4b8,
                                   (unique_ptr<PKCS7,_bssl::internal::Deleter> *)
                                   &gtest_ar__10.message_,(type *)0x0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_4b8);
                        if (!bVar1) {
                          testing::Message::Message(&local_4c0);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&gtest_ar_5.message_,(internal *)local_4b8,
                                     (AssertionResult *)"pkcs7_obj","false","true",in_R9);
                          pcVar3 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_4c8,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                                     ,0x81,pcVar3);
                          testing::internal::AssertHelper::operator=(&local_4c8,&local_4c0);
                          testing::internal::AssertHelper::~AssertHelper(&local_4c8);
                          std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
                          testing::Message::~Message(&local_4c0);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
                        if (bVar1) {
                          puVar10 = bssl::Span<const_unsigned_char>::data
                                              ((Span<const_unsigned_char> *)&certs);
                          sVar6 = bssl::Span<const_unsigned_char>::size
                                            ((Span<const_unsigned_char> *)&certs);
                          local_500 = puVar10 + sVar6;
                          testing::internal::EqHelper::
                          Compare<const_unsigned_char_*,_const_unsigned_char_*,_nullptr>
                                    ((EqHelper *)local_4f8,"ptr","der.data() + der.size()",
                                     (uchar **)&pkcs7_obj,&local_500);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_4f8);
                          if (!bVar1) {
                            testing::Message::Message(&local_508);
                            pcVar3 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_4f8);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar__11.message_,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                                       ,0x82,pcVar3);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar__11.message_,&local_508);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar__11.message_);
                            testing::Message::~Message(&local_508);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f8);
                          pPVar11 = std::unique_ptr<PKCS7,_bssl::internal::Deleter>::get
                                              ((unique_ptr<PKCS7,_bssl::internal::Deleter> *)
                                               &gtest_ar__10.message_);
                          local_524 = PKCS7_type_is_signed(pPVar11);
                          testing::AssertionResult::AssertionResult<int>
                                    ((AssertionResult *)local_520,&local_524,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_520);
                          if (!bVar1) {
                            testing::Message::Message(&local_530);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&certs3,(internal *)local_520,
                                       (AssertionResult *)"PKCS7_type_is_signed(pkcs7_obj.get())",
                                       "false","true",in_R9);
                            pcVar3 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_538,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                                       ,0x84,pcVar3);
                            testing::internal::AssertHelper::operator=(&local_538,&local_530);
                            testing::internal::AssertHelper::~AssertHelper(&local_538);
                            std::__cxx11::string::~string((string *)&certs3);
                            testing::Message::~Message(&local_530);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_520);
                          if (bVar1) {
                            pPVar11 = std::unique_ptr<PKCS7,_bssl::internal::Deleter>::operator->
                                                ((unique_ptr<PKCS7,_bssl::internal::Deleter> *)
                                                 &gtest_ar__10.message_);
                            gtest_ar_6.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl =
                                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                  )((pPVar11->d).sign)->cert;
                            psVar4 = std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::get
                                               ((unique_ptr<stack_st_X509,_bssl::internal::Deleter>
                                                 *)&gtest_ar_.message_);
                            local_578 = sk_X509_num(psVar4);
                            local_580 = sk_X509_num((stack_st_X509 *)
                                                    gtest_ar_6.message_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                            testing::internal::EqHelper::
                            Compare<unsigned_long,_unsigned_long,_nullptr>
                                      ((EqHelper *)local_570,"sk_X509_num(certs.get())",
                                       "sk_X509_num(certs3)",&local_578,&local_580);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_570);
                            if (!bVar1) {
                              testing::Message::Message(&local_588);
                              pcVar3 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_570);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&i_1,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                                         ,0x86,pcVar3);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&i_1,&local_588);
                              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_1);
                              testing::Message::~Message(&local_588);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_570)
                            ;
                            if (bVar1) {
                              a_1 = (X509 *)0x0;
                              while( true ) {
                                psVar4 = std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::
                                         get((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)
                                             &gtest_ar_.message_);
                                pXVar7 = (X509 *)sk_X509_num(psVar4);
                                if (pXVar7 <= a_1) break;
                                psVar4 = std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::
                                         get((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)
                                             &gtest_ar_.message_);
                                pXVar8 = (X509 *)sk_X509_value(psVar4,(size_t)a_1);
                                gtest_ar_7.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl =
                                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                      )sk_X509_value((stack_st_X509 *)
                                                     gtest_ar_6.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,(size_t)a_1);
                                local_5c0[1] = 0;
                                local_5c0[0] = X509_cmp(pXVar8,(X509 *)gtest_ar_7.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                          ((EqHelper *)local_5b8,"0","X509_cmp(a, b)",local_5c0 + 1,
                                           local_5c0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_5b8);
                                if (!bVar1) {
                                  testing::Message::Message(&local_5c8);
                                  pcVar3 = testing::AssertionResult::failure_message
                                                     ((AssertionResult *)local_5b8);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&result3_data,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                                             ,0x8a,pcVar3);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&result3_data,&local_5c8);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&result3_data);
                                  testing::Message::~Message(&local_5c8);
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_5b8);
                                if (!bVar1) goto LAB_004da8e2;
                                a_1 = (X509 *)((long)&a_1->cert_info + 1);
                              }
                              puStack_5d8 = (pointer)0x0;
                              pPVar9 = (PKCS7 *)std::unique_ptr<PKCS7,_bssl::internal::Deleter>::get
                                                          ((
                                                  unique_ptr<PKCS7,_bssl::internal::Deleter> *)
                                                  &gtest_ar__10.message_);
                              gtest_ar_8.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_ = i2d_PKCS7(pPVar9,&stack0xfffffffffffffa28);
                              local_5f4 = 0;
                              testing::internal::CmpHelperGT<int,int>
                                        ((internal *)local_5f0,"result3_len","0",
                                         (int *)((long)&gtest_ar_8.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                + 4),&local_5f4);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_5f0);
                              if (!bVar1) {
                                testing::Message::Message(&local_600);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_5f0);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&free_result3_data,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                                           ,0x91,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&free_result3_data,&local_600);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&free_result3_data);
                                testing::Message::~Message(&local_600);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_5f0);
                              if (bVar1) {
                                std::unique_ptr<unsigned_char,bssl::internal::Deleter>::
                                unique_ptr<bssl::internal::Deleter,void>
                                          ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)
                                           &gtest_ar_9.message_,puStack_5d8);
                                local_648.
                                super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl =
                                     (_Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>)
                                     (_Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>)
                                     certs._M_t.
                                     super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>
                                     .super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl;
                                span.size_ = sVar12;
                                span.data_ = (uchar *)certs._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_stack_st_X509_*,_false>.
                                                  _M_head_impl;
                                sStack_640 = sVar12;
                                Bytes::Bytes(&local_630,span);
                                Bytes::Bytes(&local_658,puStack_5d8,
                                             (long)gtest_ar_8.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_);
                                testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                                          ((EqHelper *)local_620,"Bytes(der)",
                                           "Bytes(result3_data, result3_len)",&local_630,&local_658)
                                ;
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_620);
                                if (!bVar1) {
                                  testing::Message::Message(&local_660);
                                  pcVar3 = testing::AssertionResult::failure_message
                                                     ((AssertionResult *)local_620);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar__12.message_,kNonFatalFailure
                                             ,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                                             ,0x93,pcVar3);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar__12.message_,&local_660);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar__12.message_);
                                  testing::Message::~Message(&local_660);
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_620);
                                psVar4 = std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::
                                         get((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)
                                             &gtest_ar_.message_);
                                pPVar9 = PKCS7_sign((X509 *)0x0,(EVP_PKEY *)0x0,
                                                    (stack_st_X509 *)psVar4,(BIO *)0x0,0x40);
                                std::unique_ptr<PKCS7,_bssl::internal::Deleter>::reset
                                          ((unique_ptr<PKCS7,_bssl::internal::Deleter> *)
                                           &gtest_ar__10.message_,(pointer)pPVar9);
                                testing::AssertionResult::
                                AssertionResult<std::unique_ptr<PKCS7,bssl::internal::Deleter>>
                                          ((AssertionResult *)local_678,
                                           (unique_ptr<PKCS7,_bssl::internal::Deleter> *)
                                           &gtest_ar__10.message_,(type *)0x0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_678);
                                if (!bVar1) {
                                  testing::Message::Message(&local_680);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)&gtest_ar__13.message_,(internal *)local_678,
                                             (AssertionResult *)"pkcs7_obj","false","true",in_R9);
                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_688,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                                             ,0x98,pcVar3);
                                  testing::internal::AssertHelper::operator=(&local_688,&local_680);
                                  testing::internal::AssertHelper::~AssertHelper(&local_688);
                                  std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
                                  testing::Message::~Message(&local_680);
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_678);
                                if (bVar1) {
                                  pPVar11 = std::unique_ptr<PKCS7,_bssl::internal::Deleter>::get
                                                      ((unique_ptr<PKCS7,_bssl::internal::Deleter> *
                                                       )&gtest_ar__10.message_);
                                  local_6bc = PKCS7_type_is_signed(pPVar11);
                                  testing::AssertionResult::AssertionResult<int>
                                            ((AssertionResult *)local_6b8,&local_6bc,(type *)0x0);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_6b8);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_6c8);
                                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                              ((string *)&certs4,(internal *)local_6b8,
                                               (AssertionResult *)
                                               "PKCS7_type_is_signed(pkcs7_obj.get())","false",
                                               "true",in_R9);
                                    pcVar3 = (char *)std::__cxx11::string::c_str();
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_6d0,kFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                                               ,0x9a,pcVar3);
                                    testing::internal::AssertHelper::operator=
                                              (&local_6d0,&local_6c8);
                                    testing::internal::AssertHelper::~AssertHelper(&local_6d0);
                                    std::__cxx11::string::~string((string *)&certs4);
                                    testing::Message::~Message(&local_6c8);
                                  }
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_6b8);
                                  if (bVar1) {
                                    pPVar11 = std::unique_ptr<PKCS7,_bssl::internal::Deleter>::
                                              operator->((unique_ptr<PKCS7,_bssl::internal::Deleter>
                                                          *)&gtest_ar__10.message_);
                                    gtest_ar_10.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl =
                                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                          )((pPVar11->d).sign)->cert;
                                    psVar4 = std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>
                                             ::get((
                                                  unique_ptr<stack_st_X509,_bssl::internal::Deleter>
                                                  *)&gtest_ar_.message_);
                                    local_710 = sk_X509_num(psVar4);
                                    local_718 = sk_X509_num((stack_st_X509 *)
                                                            gtest_ar_10.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                    testing::internal::EqHelper::
                                    Compare<unsigned_long,_unsigned_long,_nullptr>
                                              ((EqHelper *)local_708,"sk_X509_num(certs.get())",
                                               "sk_X509_num(certs4)",&local_710,&local_718);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_708);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_720);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_708);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&i_2,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                                                 ,0x9c,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&i_2,&local_720);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&i_2);
                                      testing::Message::~Message(&local_720);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_708);
                                    if (bVar1) {
                                      a_2 = (X509 *)0x0;
                                      while( true ) {
                                        psVar4 = std::
                                                 unique_ptr<stack_st_X509,_bssl::internal::Deleter>
                                                 ::get((
                                                  unique_ptr<stack_st_X509,_bssl::internal::Deleter>
                                                  *)&gtest_ar_.message_);
                                        pXVar7 = (X509 *)sk_X509_num(psVar4);
                                        if (pXVar7 <= a_2) break;
                                        psVar4 = std::
                                                 unique_ptr<stack_st_X509,_bssl::internal::Deleter>
                                                 ::get((
                                                  unique_ptr<stack_st_X509,_bssl::internal::Deleter>
                                                  *)&gtest_ar_.message_);
                                        pXVar8 = (X509 *)sk_X509_value(psVar4,(size_t)a_2);
                                        gtest_ar_11.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl =
                                             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                              )sk_X509_value((stack_st_X509 *)
                                                             gtest_ar_10.message_._M_t.
                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,(size_t)a_2);
                                        local_758[1] = 0;
                                        local_758[0] = X509_cmp(pXVar8,(X509 *)gtest_ar_11.message_.
                                                                               _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                                  ((EqHelper *)local_750,"0","X509_cmp(a, b)",
                                                   local_758 + 1,local_758);
                                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                          ((AssertionResult *)local_750);
                                        if (!bVar1) {
                                          testing::Message::Message(&local_760);
                                          pcVar3 = testing::AssertionResult::failure_message
                                                             ((AssertionResult *)local_750);
                                          testing::internal::AssertHelper::AssertHelper
                                                    ((AssertHelper *)&result4_data,kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                                                  ,0xa0,pcVar3);
                                          testing::internal::AssertHelper::operator=
                                                    ((AssertHelper *)&result4_data,&local_760);
                                          testing::internal::AssertHelper::~AssertHelper
                                                    ((AssertHelper *)&result4_data);
                                          testing::Message::~Message(&local_760);
                                        }
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)local_750);
                                        if (!bVar1) goto LAB_004da8d6;
                                        a_2 = (X509 *)((long)&a_2->cert_info + 1);
                                      }
                                      puStack_770 = (pointer)0x0;
                                      pPVar9 = (PKCS7 *)std::
                                                  unique_ptr<PKCS7,_bssl::internal::Deleter>::get
                                                            ((
                                                  unique_ptr<PKCS7,_bssl::internal::Deleter> *)
                                                  &gtest_ar__10.message_);
                                      gtest_ar_12.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._4_4_ =
                                           i2d_PKCS7(pPVar9,&stack0xfffffffffffff890);
                                      local_78c = 0;
                                      testing::internal::CmpHelperGT<int,int>
                                                ((internal *)local_788,"result4_len","0",
                                                 (int *)((long)&gtest_ar_12.message_._M_t.
                                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 4),&local_78c);
                                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_788);
                                      if (!bVar1) {
                                        testing::Message::Message(&local_798);
                                        pcVar3 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_788);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&free_result4_data,kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                                                  ,0xa6,pcVar3);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&free_result4_data,&local_798);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&free_result4_data);
                                        testing::Message::~Message(&local_798);
                                      }
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_788);
                                      if (bVar1) {
                                        std::unique_ptr<unsigned_char,bssl::internal::Deleter>::
                                        unique_ptr<bssl::internal::Deleter,void>
                                                  ((
                                                  unique_ptr<unsigned_char,bssl::internal::Deleter>
                                                  *)&gtest_ar_13.message_,puStack_770);
                                        Bytes::Bytes(&local_7c8,result2_data,result2_len);
                                        Bytes::Bytes(&local_7d8,puStack_770,
                                                     (long)gtest_ar_12.message_._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_);
                                        testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                                                  ((EqHelper *)local_7b8,
                                                   "Bytes(result_data, result_len)",
                                                   "Bytes(result4_data, result4_len)",&local_7c8,
                                                   &local_7d8);
                                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                          ((AssertionResult *)local_7b8);
                                        if (!bVar1) {
                                          testing::Message::Message(&local_7e0);
                                          pcVar3 = testing::AssertionResult::failure_message
                                                             ((AssertionResult *)local_7b8);
                                          testing::internal::AssertHelper::AssertHelper
                                                    (&local_7e8,kNonFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                                                  ,0xa8,pcVar3);
                                          testing::internal::AssertHelper::operator=
                                                    (&local_7e8,&local_7e0);
                                          testing::internal::AssertHelper::~AssertHelper(&local_7e8)
                                          ;
                                          testing::Message::~Message(&local_7e0);
                                        }
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)local_7b8);
                                        std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::
                                        ~unique_ptr((
                                                  unique_ptr<unsigned_char,_bssl::internal::Deleter>
                                                  *)&gtest_ar_13.message_);
                                      }
                                    }
                                  }
                                }
LAB_004da8d6:
                                std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                                          ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)
                                           &gtest_ar_9.message_);
                              }
                            }
                          }
                        }
LAB_004da8e2:
                        std::unique_ptr<PKCS7,_bssl::internal::Deleter>::~unique_ptr
                                  ((unique_ptr<PKCS7,_bssl::internal::Deleter> *)
                                   &gtest_ar__10.message_);
                        std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                                  ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)
                                   &gtest_ar_4.message_);
                      }
                    }
                  }
                }
              }
LAB_004da8fa:
              std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&gtest_ar__6.message_
                        );
            }
          }
        }
        bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
                  ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&gtest_ar__3.message_);
      }
    }
    std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
  }
  std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

static void TestCertReparse(bssl::Span<const uint8_t> der) {
  bssl::UniquePtr<STACK_OF(X509)> certs(sk_X509_new_null());
  ASSERT_TRUE(certs);
  bssl::UniquePtr<STACK_OF(X509)> certs2(sk_X509_new_null());
  ASSERT_TRUE(certs2);
  uint8_t *result_data, *result2_data;
  size_t result_len, result2_len;

  CBS pkcs7 = der;
  ASSERT_TRUE(PKCS7_get_certificates(certs.get(), &pkcs7));
  EXPECT_EQ(0u, CBS_len(&pkcs7));

  bssl::ScopedCBB cbb;
  ASSERT_TRUE(CBB_init(cbb.get(), der.size()));
  ASSERT_TRUE(PKCS7_bundle_certificates(cbb.get(), certs.get()));
  ASSERT_TRUE(CBB_finish(cbb.get(), &result_data, &result_len));
  bssl::UniquePtr<uint8_t> free_result_data(result_data);

  CBS_init(&pkcs7, result_data, result_len);
  ASSERT_TRUE(PKCS7_get_certificates(certs2.get(), &pkcs7));
  EXPECT_EQ(0u, CBS_len(&pkcs7));

  // PKCS#7 stores certificates in a SET OF, so |PKCS7_bundle_certificates| may
  // not preserve the original order. All of our test inputs are already sorted,
  // but this check should be relaxed if we add others.
  ASSERT_EQ(sk_X509_num(certs.get()), sk_X509_num(certs2.get()));
  for (size_t i = 0; i < sk_X509_num(certs.get()); i++) {
    X509 *a = sk_X509_value(certs.get(), i);
    X509 *b = sk_X509_value(certs2.get(), i);
    ASSERT_EQ(0, X509_cmp(a, b));
  }

  ASSERT_TRUE(CBB_init(cbb.get(), der.size()));
  ASSERT_TRUE(PKCS7_bundle_certificates(cbb.get(), certs2.get()));
  ASSERT_TRUE(CBB_finish(cbb.get(), &result2_data, &result2_len));
  bssl::UniquePtr<uint8_t> free_result2_data(result2_data);

  EXPECT_EQ(Bytes(result_data, result_len), Bytes(result2_data, result2_len));

  // Parse with the legacy API instead.
  const uint8_t *ptr = der.data();
  bssl::UniquePtr<PKCS7> pkcs7_obj(d2i_PKCS7(nullptr, &ptr, der.size()));
  ASSERT_TRUE(pkcs7_obj);
  EXPECT_EQ(ptr, der.data() + der.size());

  ASSERT_TRUE(PKCS7_type_is_signed(pkcs7_obj.get()));
  const STACK_OF(X509) *certs3 = pkcs7_obj->d.sign->cert;
  ASSERT_EQ(sk_X509_num(certs.get()), sk_X509_num(certs3));
  for (size_t i = 0; i < sk_X509_num(certs.get()); i++) {
    X509 *a = sk_X509_value(certs.get(), i);
    X509 *b = sk_X509_value(certs3, i);
    ASSERT_EQ(0, X509_cmp(a, b));
  }

  // Serialize the original object. This should echo back the original saved
  // bytes.
  uint8_t *result3_data = nullptr;
  int result3_len = i2d_PKCS7(pkcs7_obj.get(), &result3_data);
  ASSERT_GT(result3_len, 0);
  bssl::UniquePtr<uint8_t> free_result3_data(result3_data);
  EXPECT_EQ(Bytes(der), Bytes(result3_data, result3_len));

  // Make a new object with the legacy API.
  pkcs7_obj.reset(
      PKCS7_sign(nullptr, nullptr, certs.get(), nullptr, PKCS7_DETACHED));
  ASSERT_TRUE(pkcs7_obj);

  ASSERT_TRUE(PKCS7_type_is_signed(pkcs7_obj.get()));
  const STACK_OF(X509) *certs4 = pkcs7_obj->d.sign->cert;
  ASSERT_EQ(sk_X509_num(certs.get()), sk_X509_num(certs4));
  for (size_t i = 0; i < sk_X509_num(certs.get()); i++) {
    X509 *a = sk_X509_value(certs.get(), i);
    X509 *b = sk_X509_value(certs4, i);
    ASSERT_EQ(0, X509_cmp(a, b));
  }

  // This new object should serialize canonically.
  uint8_t *result4_data = nullptr;
  int result4_len = i2d_PKCS7(pkcs7_obj.get(), &result4_data);
  ASSERT_GT(result4_len, 0);
  bssl::UniquePtr<uint8_t> free_result4_data(result4_data);
  EXPECT_EQ(Bytes(result_data, result_len), Bytes(result4_data, result4_len));
}